

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_ch_Test::~Buffer_change_event_add_ch_Test
          (Buffer_change_event_add_ch_Test *this)

{
  Buffer_change_event_add_ch_Test *this_local;
  
  ~Buffer_change_event_add_ch_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, change_event_add_ch) {
    BufferWithReadonlyStrings local;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = 1,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_ch(&local.buf, 'x'));
    EXPECT_EQ(changes_t{expected}, local.changes);
}